

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O0

void __thiscall
TTD::ExecutionInfoManager::AddPreservedBPsForTopLevelLoad
          (ExecutionInfoManager *this,uint32 topLevelBodyId,FunctionBody *body)

{
  code *pcVar1;
  Type TVar2;
  int iVar3;
  Utf8SourceInfo *pUVar4;
  Utf8SourceInfo *pUVar5;
  bool bVar6;
  int iVar7;
  uint32 uVar8;
  uint32 uVar9;
  Type *ppTVar10;
  int64 iVar11;
  ScriptContext *this_00;
  ThreadContext *pTVar12;
  TTDebuggerSourceLocation *local_50;
  int local_44;
  TTDebuggerSourceLocation *pTStack_40;
  BOOL isNewBP;
  TTDebuggerSourceLocation *bpLocation;
  Utf8SourceInfo *pUStack_30;
  int32 i;
  Utf8SourceInfo *utf8SourceInfo;
  ScriptContext *ctx;
  FunctionBody *body_local;
  ExecutionInfoManager *pEStack_10;
  uint32 topLevelBodyId_local;
  ExecutionInfoManager *this_local;
  
  ctx = (ScriptContext *)body;
  body_local._4_4_ = topLevelBodyId;
  pEStack_10 = this;
  utf8SourceInfo = (Utf8SourceInfo *)Js::FunctionProxy::GetScriptContext((FunctionProxy *)body);
  pUStack_30 = Js::FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)ctx);
  bpLocation._4_4_ = 0;
  do {
    iVar3 = bpLocation._4_4_;
    iVar7 = JsUtil::
            ReadOnlyList<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_DefaultComparer>::
            Count(&(this->m_unRestoredBreakpoints).
                   super_ReadOnlyList<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_DefaultComparer>
                 );
    if (iVar7 <= iVar3) {
      bVar6 = TTDebuggerSourceLocation::HasValue(&this->m_activeTTDBP);
      if (((bVar6) && (this->m_activeBPId == -1)) &&
         (uVar8 = TTDebuggerSourceLocation::GetTopLevelBodyId(&this->m_activeTTDBP),
         uVar8 == body_local._4_4_)) {
        this_00 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)ctx);
        pTVar12 = Js::ScriptContext::GetThreadContext(this_00);
        SetActiveBP_Helper(this,pTVar12->TTDContext);
      }
      return;
    }
    ppTVar10 = JsUtil::
               List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(&this->m_unRestoredBreakpoints,bpLocation._4_4_);
    if (*ppTVar10 != (Type)0x0) {
      ppTVar10 = JsUtil::
                 List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(&this->m_unRestoredBreakpoints,bpLocation._4_4_);
      pTStack_40 = *ppTVar10;
      uVar8 = TTDebuggerSourceLocation::GetTopLevelBodyId(pTStack_40);
      if (uVar8 == body_local._4_4_) {
        local_44 = 0;
        pcVar1 = (code *)utf8SourceInfo[0x1a].debugModeSourceLength;
        TVar2 = utf8SourceInfo[0x1a].m_secondaryHostSourceContext;
        iVar11 = TTDebuggerSourceLocation::GetBPId(pTStack_40);
        pUVar5 = utf8SourceInfo;
        pUVar4 = pUStack_30;
        uVar8 = TTDebuggerSourceLocation::GetSourceLine(pTStack_40);
        uVar9 = TTDebuggerSourceLocation::GetSourceColumn(pTStack_40);
        (*pcVar1)(TVar2,iVar11,pUVar5,pUVar4,uVar8,uVar9,&local_44);
        if (local_44 == 0) {
          TTDAbort_unrecoverable_error("We should be restoring a breapoint we removed previously!");
        }
        local_50 = (TTDebuggerSourceLocation *)0x0;
        JsUtil::
        List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::SetItem(&this->m_unRestoredBreakpoints,bpLocation._4_4_,&local_50);
      }
    }
    bpLocation._4_4_ = bpLocation._4_4_ + 1;
  } while( true );
}

Assistant:

void ExecutionInfoManager::AddPreservedBPsForTopLevelLoad(uint32 topLevelBodyId, Js::FunctionBody* body)
    {
        Js::ScriptContext* ctx = body->GetScriptContext();
        Js::Utf8SourceInfo* utf8SourceInfo = body->GetUtf8SourceInfo();

        for(int32 i = 0; i < this->m_unRestoredBreakpoints.Count(); ++i)
        {
            if(this->m_unRestoredBreakpoints.Item(i) == nullptr)
            {
                continue;
            }

            const TTDebuggerSourceLocation* bpLocation = this->m_unRestoredBreakpoints.Item(i);
            if(bpLocation->GetTopLevelBodyId() == topLevelBodyId)
            {
                BOOL isNewBP = FALSE;
                ctx->TTDHostCallbackFunctor.pfOnBPRegisterCallback(ctx->TTDHostCallbackFunctor.HostRuntime, bpLocation->GetBPId(), ctx, utf8SourceInfo, bpLocation->GetSourceLine(), bpLocation->GetSourceColumn(), &isNewBP);
                TTDAssert(isNewBP, "We should be restoring a breapoint we removed previously!");

                //Now that it is set we can clear it from our list
                this->m_unRestoredBreakpoints.SetItem(i, nullptr);
            }
        }

        if(this->m_activeTTDBP.HasValue() && (this->m_activeBPId == -1) && (this->m_activeTTDBP.GetTopLevelBodyId() == topLevelBodyId))
        {
            this->SetActiveBP_Helper(body->GetScriptContext()->GetThreadContext()->TTDContext);
        }
    }